

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::FromPropertyDescriptor
              (PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *this;
  DynamicObject *instance;
  Var pvVar2;
  DynamicObject *object;
  ScriptContext *scriptContext_local;
  PropertyDescriptor *descriptor_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  instance = JavascriptLibrary::CreateObject(this,false,0);
  bVar1 = PropertyDescriptor::IsDataDescriptor(descriptor);
  if (bVar1) {
    bVar1 = PropertyDescriptor::ValueSpecified(descriptor);
    if (bVar1) {
      pvVar2 = PropertyDescriptor::GetValue(descriptor);
      InitProperty(&instance->super_RecyclableObject,0x197,pvVar2,PropertyOperation_None);
    }
    bVar1 = PropertyDescriptor::WritableSpecified(descriptor);
    if (bVar1) {
      bVar1 = PropertyDescriptor::IsWritable(descriptor);
      pvVar2 = JavascriptBoolean::ToVar((uint)bVar1,scriptContext);
      InitProperty(&instance->super_RecyclableObject,0x196,pvVar2,PropertyOperation_None);
    }
  }
  else {
    bVar1 = PropertyDescriptor::IsAccessorDescriptor(descriptor);
    if (bVar1) {
      pvVar2 = PropertyDescriptor::GetGetter(descriptor);
      pvVar2 = CanonicalizeAccessor(pvVar2,scriptContext);
      InitProperty(&instance->super_RecyclableObject,0x198,pvVar2,PropertyOperation_None);
      pvVar2 = PropertyDescriptor::GetSetter(descriptor);
      pvVar2 = CanonicalizeAccessor(pvVar2,scriptContext);
      InitProperty(&instance->super_RecyclableObject,0x19b,pvVar2,PropertyOperation_None);
    }
  }
  bVar1 = PropertyDescriptor::EnumerableSpecified(descriptor);
  if (bVar1) {
    bVar1 = PropertyDescriptor::IsEnumerable(descriptor);
    pvVar2 = JavascriptBoolean::ToVar((uint)bVar1,scriptContext);
    InitProperty(&instance->super_RecyclableObject,0x194,pvVar2,PropertyOperation_None);
  }
  bVar1 = PropertyDescriptor::ConfigurableSpecified(descriptor);
  if (bVar1) {
    bVar1 = PropertyDescriptor::IsConfigurable(descriptor);
    pvVar2 = JavascriptBoolean::ToVar((uint)bVar1,scriptContext);
    InitProperty(&instance->super_RecyclableObject,0x195,pvVar2,PropertyOperation_None);
  }
  return instance;
}

Assistant:

Var JavascriptOperators::FromPropertyDescriptor(const PropertyDescriptor& descriptor, ScriptContext* scriptContext)
    {
        DynamicObject* object = scriptContext->GetLibrary()->CreateObject();

        // ES5 Section 8.10.4 specifies the order for adding these properties.
        if (descriptor.IsDataDescriptor())
        {
            if (descriptor.ValueSpecified())
            {
                JavascriptOperators::InitProperty(object, PropertyIds::value, descriptor.GetValue());
            }
            if (descriptor.WritableSpecified())
            {
                JavascriptOperators::InitProperty(object, PropertyIds::writable, JavascriptBoolean::ToVar(descriptor.IsWritable(), scriptContext));
            }
        }
        else if (descriptor.IsAccessorDescriptor())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::get, JavascriptOperators::CanonicalizeAccessor(descriptor.GetGetter(), scriptContext));
            JavascriptOperators::InitProperty(object, PropertyIds::set, JavascriptOperators::CanonicalizeAccessor(descriptor.GetSetter(), scriptContext));
        }

        if (descriptor.EnumerableSpecified())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::enumerable, JavascriptBoolean::ToVar(descriptor.IsEnumerable(), scriptContext));
        }
        if (descriptor.ConfigurableSpecified())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::configurable, JavascriptBoolean::ToVar(descriptor.IsConfigurable(), scriptContext));
        }
        return object;
    }